

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

string * helics::CoreFactory::MasterCoreBuilder::getIndexedBuilderName_abi_cxx11_(size_t index)

{
  string_view message;
  HelicsException *this;
  element_type *peVar1;
  size_type sVar2;
  undefined8 uVar3;
  __tuple_element_t<1UL,_tuple<int,_basic_string<char,_char_traits<char>,_allocator<char>_>,_shared_ptr<CoreBuilder>_>_>
  *p_Var4;
  ulong in_RDI;
  char *unaff_retaddr;
  shared_ptr<helics::CoreFactory::MasterCoreBuilder> *blder;
  char *in_stack_ffffffffffffffe8;
  
  this = (HelicsException *)instance();
  peVar1 = std::
           __shared_ptr_access<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4fbfbd);
  sVar2 = std::
          vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
          ::size(&peVar1->builders);
  if (sVar2 <= in_RDI) {
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this,in_stack_ffffffffffffffe8);
    message._M_str = unaff_retaddr;
    message._M_len = in_RDI;
    HelicsException::HelicsException(this,message);
    __cxa_throw(uVar3,&HelicsException::typeinfo,HelicsException::~HelicsException);
  }
  peVar1 = std::
           __shared_ptr_access<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4fc01f);
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>_>_>
  ::operator[](&peVar1->builders,in_RDI);
  p_Var4 = std::get<1ul,int,std::__cxx11::string,std::shared_ptr<helics::CoreFactory::CoreBuilder>>
                     ((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::CoreFactory::CoreBuilder>_>
                       *)0x4fc034);
  return p_Var4;
}

Assistant:

static const std::string& getIndexedBuilderName(std::size_t index)
    {
        const auto& blder = instance();
        if (blder->builders.size() <= index) {
            throw(HelicsException("core type index is not available"));
        }
        return std::get<1>(blder->builders[index]);
    }